

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O0

void __thiscall
Iir::RBJ::BandShelf::setupN(BandShelf *this,double centerFrequency,double gainDb,double bandWidth)

{
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double b2_00;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double a2;
  double a1;
  double a0;
  double b2;
  double b1;
  double b0;
  double AL;
  double sn;
  double cs;
  double w0;
  double A;
  char *in_stack_ffffffffffffff90;
  
  dVar2 = pow(10.0,in_XMM1_Qa / 40.0);
  dVar3 = in_XMM0_Qa * 6.283185307179586;
  dVar4 = cos(dVar3);
  b2_00 = sin(dVar3);
  dVar3 = sinh((in_XMM2_Qa * 0.34657359027997264 * dVar3) / b2_00);
  dVar3 = b2_00 * dVar3;
  bVar1 = is_nan<double>(dVar3);
  if (bVar1) {
    throw_invalid_argument(in_stack_ffffffffffffff90);
  }
  Biquad::setCoefficients
            ((Biquad *)(dVar3 * dVar2 + 1.0),dVar4 * -2.0,-dVar3 * dVar2 + 1.0,dVar3 / dVar2 + 1.0,
             dVar4 * -2.0,1.0 - dVar3 / dVar2,b2_00);
  return;
}

Assistant:

void BandShelf::setupN (double centerFrequency,
			       double gainDb,
			       double bandWidth)
	{
		double A  = pow (10, gainDb/40);
		double w0 = 2 * doublePi * centerFrequency;
		double cs = cos(w0);
		double sn = sin(w0);
		double AL = sn * sinh( doubleLn2/2 * bandWidth * w0/sn );
		if (Iir::is_nan (AL))
			throw_invalid_argument("No solution available for these parameters.\n");
		double b0 =  1 + AL * A;
		double b1 = -2 * cs;
		double b2 =  1 - AL * A;
		double a0 =  1 + AL / A;
		double a1 = -2 * cs;
		double a2 =  1 - AL / A;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}